

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_TestDepth_Test::TestBody(TypeTest_TestDepth_Test *this)

{
  undefined8 uVar1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  Array AVar3;
  HeapType A;
  HeapType B;
  HeapType C;
  HeapType sig;
  AssertHelper local_78;
  TypeBuilder local_70;
  TypeBuilder builder;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  undefined1 local_48 [24];
  byte local_30;
  AssertHelper local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  ::wasm::HeapType::HeapType(&C,(Signature)ZEXT816(0));
  ::wasm::TypeBuilder::TypeBuilder(&local_70,3);
  local_48._0_8_ = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  ::wasm::TypeBuilder::setOpen((ulong)&local_70,false);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_70,(Struct *)0x0);
  if ((void *)local_48._0_8_ != (void *)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  local_48._0_8_ = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  ::wasm::TypeBuilder::setOpen((ulong)&local_70,true);
  uVar1 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_70);
  ::wasm::TypeBuilder::setSubType(&local_70,1,uVar1,1);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_70,(Struct *)0x1);
  if ((void *)local_48._0_8_ != (void *)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  ::wasm::TypeBuilder::setOpen((ulong)&local_70,true);
  local_48._0_8_ = 2;
  local_48._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AVar3.element._8_8_ = local_48;
  AVar3.element.type.id = 2;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_70,AVar3);
  ::wasm::TypeBuilder::build();
  local_28.data_._0_1_ = local_30 == 0;
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 == 0) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)local_48);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&builder,__x);
    operator_delete((void *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                    (long)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)builder.impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_30]._M_data)
              ((anon_class_1_0_00000001 *)&builder,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)local_48);
    ::wasm::TypeBuilder::~TypeBuilder(&local_70);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = local_28.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::any.getDepth()","0U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x66f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::eq.getDepth()","1U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x670,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::array.getDepth()","2U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x671,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::struct_.getDepth()","2U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x672,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"A.getDepth()","3U",(unsigned_long *)&builder,(uint *)&local_28)
    ;
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x673,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"B.getDepth()","4U",(unsigned_long *)&builder,(uint *)&local_28)
    ;
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x674,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"C.getDepth()","3U",(unsigned_long *)&builder,(uint *)&local_28)
    ;
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x675,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = local_28.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::func.getDepth()","0U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x678,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"sig.getDepth()","1U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x679,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = local_28.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::cont.getDepth()","0U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x67c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    ::wasm::HeapType::HeapType((HeapType *)&local_28,(Continuation)C.id);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_70.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapType(Continuation(sig)).getDepth()","1U",
               (unsigned_long *)&builder,(uint *)&local_70);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x67d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = local_28.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::ext.getDepth()","0U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x67f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::i31.getDepth()","2U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x681,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_48,"HeapTypes::string.getDepth()","1U",(unsigned_long *)&builder,
               (uint *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x682,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = (AssertHelperData *)0xffffffffffffffff;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_48,"HeapTypes::none.getDepth()","size_t(-1)",
               (unsigned_long *)&builder,(unsigned_long *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x684,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = (AssertHelperData *)0xffffffffffffffff;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_48,"HeapTypes::nofunc.getDepth()","size_t(-1)",
               (unsigned_long *)&builder,(unsigned_long *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x685,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         ::wasm::HeapType::getDepth();
    local_28.data_ = (AssertHelperData *)0xffffffffffffffff;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_48,"HeapTypes::noext.getDepth()","size_t(-1)",
               (unsigned_long *)&builder,(unsigned_long *)&local_28);
    if (local_48[0] == '\0') {
      testing::Message::Message((Message *)&builder);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x686,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&builder);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (builder.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_48 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48._8_8_);
    }
  }
  else {
    testing::Message::Message((Message *)&sig);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)&local_28,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x667,(char *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
    ;
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      (ulong)((long)&(built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
    }
    if (sig.id != 0) {
      (**(code **)(*(long *)sig.id + 8))();
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_30]._M_data)
              ((anon_class_1_0_00000001 *)&builder,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)local_48);
    ::wasm::TypeBuilder::~TypeBuilder(&local_70);
  }
  return;
}

Assistant:

TEST_F(TypeTest, TestDepth) {
  HeapType A, B, C;
  HeapType sig = HeapType(Signature(Type::none, Type::none));
  {
    TypeBuilder builder(3);
    builder[0].setOpen() = Struct();
    builder[1].setOpen().subTypeOf(builder[0]) = Struct();
    builder[2].setOpen() = Array(Field(Type::i32, Immutable));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
    C = built[2];
  }

  // any :> eq :> array :> specific array types
  EXPECT_EQ(HeapTypes::any.getDepth(), 0U);
  EXPECT_EQ(HeapTypes::eq.getDepth(), 1U);
  EXPECT_EQ(HeapTypes::array.getDepth(), 2U);
  EXPECT_EQ(HeapTypes::struct_.getDepth(), 2U);
  EXPECT_EQ(A.getDepth(), 3U);
  EXPECT_EQ(B.getDepth(), 4U);
  EXPECT_EQ(C.getDepth(), 3U);

  // Signature types are subtypes of func.
  EXPECT_EQ(HeapTypes::func.getDepth(), 0U);
  EXPECT_EQ(sig.getDepth(), 1U);

  // Continuation types are subtypes of cont.
  EXPECT_EQ(HeapTypes::cont.getDepth(), 0U);
  EXPECT_EQ(HeapType(Continuation(sig)).getDepth(), 1U);

  EXPECT_EQ(HeapTypes::ext.getDepth(), 0U);

  EXPECT_EQ(HeapTypes::i31.getDepth(), 2U);
  EXPECT_EQ(HeapTypes::string.getDepth(), 1U);

  EXPECT_EQ(HeapTypes::none.getDepth(), size_t(-1));
  EXPECT_EQ(HeapTypes::nofunc.getDepth(), size_t(-1));
  EXPECT_EQ(HeapTypes::noext.getDepth(), size_t(-1));
}